

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O3

ze_result_t
zetGetCommandListExpProcAddrTable
          (ze_api_version_t version,zet_command_list_exp_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  ze_result_t zVar2;
  code *UNRECOVERED_JUMPTABLE;
  iterator __begin1;
  undefined8 *puVar3;
  
  puVar3 = *(undefined8 **)(loader::context + 0x15e0);
  puVar1 = *(undefined8 **)(loader::context + 0x15e8);
  zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  if (puVar1 != puVar3) {
    if (pDdiTable == (zet_command_list_exp_dditable_t *)0x0) {
      zVar2 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    else {
      zVar2 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
      if ((int)version <= *(int *)(loader::context + 0x15c0)) {
        zVar2 = ZE_RESULT_SUCCESS;
        do {
          if (*(int *)(puVar3 + 1) == 0) {
            UNRECOVERED_JUMPTABLE = (code *)dlsym(*puVar3,"zetGetCommandListExpProcAddrTable");
            if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
              zVar2 = (*UNRECOVERED_JUMPTABLE)(version,puVar3 + 0xe5);
            }
          }
          puVar3 = puVar3 + 0x1b3;
        } while (puVar3 != puVar1);
        if (zVar2 == ZE_RESULT_SUCCESS) {
          UNRECOVERED_JUMPTABLE = loader::zetCommandListAppendMarkerExp;
          if (((ulong)((*(long *)(loader::context + 0x15e8) - *(long *)(loader::context + 0x15e0) >>
                       3) * 0x7aff6957aff6957b) < 2) &&
             (*(char *)(loader::context + 0x1629) == '\0')) {
            UNRECOVERED_JUMPTABLE = *(code **)(*(long *)(loader::context + 0x15e0) + 0x728);
          }
          pDdiTable->pfnAppendMarkerExp = UNRECOVERED_JUMPTABLE;
          if (*(long *)(loader::context + 0x1618) == 0) {
            zVar2 = ZE_RESULT_SUCCESS;
          }
          else {
            UNRECOVERED_JUMPTABLE =
                 (code *)dlsym(*(long *)(loader::context + 0x1618),
                               "zetGetCommandListExpProcAddrTable");
            zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
            if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
              zVar2 = (*UNRECOVERED_JUMPTABLE)(version,pDdiTable);
              return zVar2;
            }
          }
        }
      }
    }
  }
  return zVar2;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zetGetCommandListExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zet_command_list_exp_dditable_t* pDdiTable      ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zet_pfnGetCommandListExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zetGetCommandListExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.zet.CommandListExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnAppendMarkerExp                          = loader::zetCommandListAppendMarkerExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.zet.CommandListExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zet_pfnGetCommandListExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zetGetCommandListExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}